

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

Path * FileSystemUtils::GetCurrentPath(void)

{
  char *rhs_;
  Path *in_RDI;
  char *currdir;
  Path *currPath;
  
  Path::Path(in_RDI);
  rhs_ = getcwd((char *)0x0,0);
  Path::operator=(in_RDI,rhs_);
  free(rhs_);
  return in_RDI;
}

Assistant:

inline Path GetCurrentPath()
	{
		Path currPath;
#ifdef _WIN32
		std::wstring temp;
		DWORD requiredSize = GetCurrentDirectoryW( 0, NULL );
		if( requiredSize > 0 )
		{
			temp.resize( requiredSize );
			GetCurrentDirectoryW( requiredSize, &temp[0] );
			temp.pop_back();
		}
		currPath = _Win32Utf16ToUtf8( temp );
#else
		char* currdir = getcwd(0,0);
		currPath = currdir;
		free( currdir );
#endif
		
		return currPath;
	}